

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_1.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  undefined1 *this;
  void *pvVar1;
  void *ptr;
  MemContext<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void> memCtx;
  undefined1 local_fa30 [7];
  NoActionMemLogger logger;
  FixedArena arena;
  char buffer [64000];
  char **argv_local;
  int argc_local;
  
  cookmem::FixedArena::FixedArena((FixedArena *)local_fa30,&arena.m_used,64000);
  this = &memCtx.m_pool.field_0x247;
  cookmem::NoActionMemLogger::NoActionMemLogger((NoActionMemLogger *)this);
  cookmem::MemContext<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void>::MemContext
            ((MemContext<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void> *)&ptr,
             (FixedArena *)local_fa30,(NoActionMemLogger *)this,false);
  pvVar1 = cookmem::MemContext<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void>::allocate
                     ((MemContext<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void> *)&ptr,100)
  ;
  cookmem::MemContext<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void>::deallocate
            ((MemContext<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void> *)&ptr,pvVar1,0);
  pvVar1 = cookmem::MemContext<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void>::callocate
                     ((MemContext<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void> *)&ptr,1,
                      100);
  pvVar1 = cookmem::MemContext<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void>::reallocate
                     ((MemContext<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void> *)&ptr,
                      pvVar1,1000);
  cookmem::MemContext<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void>::deallocate
            ((MemContext<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void> *)&ptr,pvVar1,0);
  cookmem::MemContext<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void>::~MemContext
            ((MemContext<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void> *)&ptr);
  return 0;
}

Assistant:

int
main (int argc, const char* argv[])
{
    char buffer[64000];
    cookmem::FixedArena arena (buffer, sizeof(buffer));
    cookmem::NoActionMemLogger logger;
    cookmem::MemContext<cookmem::FixedArena, cookmem::NoActionMemLogger> memCtx (arena, logger);

    // Allocate memory
    void* ptr = memCtx.allocate (100);

    // Free the memory
    memCtx.deallocate (ptr);

    // Much like calloc in c, allocate 100 bytes which is set to 0.
    ptr = memCtx.callocate (1, 100);

    // Change the size of the memory
    ptr = memCtx.reallocate (ptr, 1000);

    // Free the memory
    memCtx.deallocate (ptr);

    return 0;
}